

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::~HttpInputStreamImpl(HttpInputStreamImpl *this)

{
  PromiseArenaMember *node;
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  node = &((this->messageReadQueue).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->messageReadQueue).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  pPVar1 = (this->onMessageDone).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (this->onMessageDone).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar2 = (this->onMessageDone).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
  }
  if ((this->resumingRequest).ptr.isSet == true) {
    if ((this->resumingRequest).ptr.field_1.value.tag == 1) {
      (this->resumingRequest).ptr.field_1.value.tag = 0;
    }
    if ((this->resumingRequest).ptr.field_1.value.tag == 2) {
      (this->resumingRequest).ptr.field_1.value.tag = 0;
    }
  }
  HttpHeaders::~HttpHeaders(&this->headers);
  pcVar3 = (this->headerBuffer).ptr;
  if (pcVar3 != (char *)0x0) {
    sVar4 = (this->headerBuffer).size_;
    (this->headerBuffer).ptr = (char *)0x0;
    (this->headerBuffer).size_ = 0;
    pAVar5 = (this->headerBuffer).disposer;
    (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
  }
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::~WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>);
  return;
}

Assistant:

static kj::OneOf<HttpHeaders::Request, HttpHeaders::ConnectRequest> getResumingRequest(
      kj::OneOf<HttpMethod, HttpConnectMethod> method,
      kj::StringPtr url) {
    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) {
        return HttpHeaders::Request { m, url };
      }
      KJ_CASE_ONEOF(m, HttpConnectMethod) {
        return HttpHeaders::ConnectRequest { url };
      }
    }
    KJ_UNREACHABLE;
  }